

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O0

void __thiscall CJSON::AddPair<long_double*>(CJSON *this,string *Name,longdouble **val,size_t Size)

{
  bool bVar1;
  CJSONException *this_00;
  mapped_type *this_01;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_85;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Self local_38;
  _Self local_30;
  size_t local_28;
  size_t Size_local;
  longdouble **val_local;
  string *Name_local;
  CJSON *this_local;
  
  local_28 = Size;
  Size_local = (size_t)val;
  val_local = (longdouble **)Name;
  Name_local = (string *)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->m_Values,Name);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->m_Values);
  bVar1 = std::operator!=(&local_30,&local_38);
  if (!bVar1) {
    ArrayToStr<long_double_*,_nullptr>(&local_e8,this,(longdouble **)Size_local,local_28);
    std::operator+(&local_c8,'[',&local_e8);
    std::operator+(&local_a8,&local_c8,']');
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->m_Values,(key_type *)val_local);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    return;
  }
  local_85 = 1;
  this_00 = (CJSONException *)__cxa_allocate_exception(0x30);
  std::operator+(&local_78,"Name \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_local);
  std::operator+(&local_58,&local_78,"\' already exists!");
  CJSONException::CJSONException(this_00,&local_58,NAME_ALREADY_EXITS);
  local_85 = 0;
  __cxa_throw(this_00,&CJSONException::typeinfo,CJSONException::~CJSONException);
}

Assistant:

inline void AddPair(const std::string &Name, const T &val, size_t Size)
        {
            if(m_Values.find(Name) != m_Values.end())
                throw CJSONException("Name '" + Name + "' already exists!", JSONErrorType::NAME_ALREADY_EXITS);         

            m_Values[Name] = '[' + ArrayToStr(val, Size) + ']'; 
        }